

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall
QHeaderView::paintSection(QHeaderView *this,QPainter *painter,QRect *rect,int logicalIndex)

{
  bool bVar1;
  QBrush *pQVar2;
  QStyle *pQVar3;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  QPoint *in_RSI;
  QPainter *in_RDI;
  long in_FS_OFFSET;
  QBrush nBrushWindow;
  QBrush nBrushButton;
  QBrush oBrushWindow;
  QBrush oBrushButton;
  QPointF oldBO;
  QStyleOptionHeaderV2 opt;
  undefined4 in_stack_fffffffffffffef8;
  ColorRole in_stack_fffffffffffffefc;
  QRect *in_stack_ffffffffffffff00;
  QPoint *p;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QRect::isValid(in_stack_ffffffffffffff00);
  if (bVar1) {
    memset(local_90,0xaa,0x88);
    QStyleOptionHeaderV2::QStyleOptionHeaderV2((QStyleOptionHeaderV2 *)0x83fd6a);
    local_a0 = 0xffffffffffffffff;
    local_98 = 0xffffffffffffffff;
    local_a8 = QPainter::brushOrigin();
    QPointF::QPointF((QPointF *)in_stack_ffffffffffffff00,
                     (QPoint *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    (**(code **)(*(long *)in_RDI + 0x318))(in_RDI,local_90);
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QPalette::brush((QPalette *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QBrush::QBrush((QBrush *)&local_b0,pQVar2);
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QPalette::brush((QPalette *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QBrush::QBrush((QBrush *)&local_b8,pQVar2);
    (**(code **)(*(long *)in_RDI + 0x310))(in_RDI,local_90,in_ECX);
    local_80 = *in_RDX;
    local_78 = in_RDX[1];
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QPalette::brush((QPalette *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QBrush::QBrush((QBrush *)&local_c0,pQVar2);
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QPalette::brush((QPalette *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QBrush::QBrush((QBrush *)&local_c8,pQVar2);
    bVar1 = QBrush::operator!=((QBrush *)in_stack_ffffffffffffff00,
                               (QBrush *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if ((bVar1) ||
       (bVar1 = QBrush::operator!=((QBrush *)in_stack_ffffffffffffff00,
                                   (QBrush *)
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
       bVar1)) {
      p = in_RSI;
      QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QPainter::setBrushOrigin(in_RDI,p);
    }
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                           );
    (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,0x17,local_90,in_RSI,in_RDI);
    QPainter::setBrushOrigin((QPointF *)in_RSI);
    QBrush::~QBrush((QBrush *)&local_c8);
    QBrush::~QBrush((QBrush *)&local_c0);
    QBrush::~QBrush((QBrush *)&local_b8);
    QBrush::~QBrush((QBrush *)&local_b0);
    QStyleOptionHeaderV2::~QStyleOptionHeaderV2((QStyleOptionHeaderV2 *)0x83ff55);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::paintSection(QPainter *painter, const QRect &rect, int logicalIndex) const
{
    if (!rect.isValid())
        return;

    QStyleOptionHeaderV2 opt;
    QPointF oldBO = painter->brushOrigin();

    initStyleOption(&opt);

    QBrush oBrushButton = opt.palette.brush(QPalette::Button);
    QBrush oBrushWindow = opt.palette.brush(QPalette::Window);

    initStyleOptionForIndex(&opt, logicalIndex);
    // We set rect here. If it needs to be changed it can be changed by overriding this function
    opt.rect = rect;

    QBrush nBrushButton = opt.palette.brush(QPalette::Button);
    QBrush nBrushWindow = opt.palette.brush(QPalette::Window);

    // If relevant brushes are not the same as from the regular widgets we set the brush origin
    if (oBrushButton != nBrushButton || oBrushWindow != nBrushWindow) {
        painter->setBrushOrigin(opt.rect.topLeft());
    }

    // draw the section.
    style()->drawControl(QStyle::CE_Header, &opt, painter, this);
    painter->setBrushOrigin(oldBO);
}